

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O0

void gainstr(obj *otmp,int incr,boolean force)

{
  int iVar1;
  int local_24;
  int local_20;
  int local_1c;
  int num;
  boolean force_local;
  int incr_local;
  obj *otmp_local;
  
  local_1c = 1;
  iVar1 = incr;
  if (incr == 0) {
    if (u.acurr.a[0] < '\x12') {
      iVar1 = rn2(4);
      if (iVar1 == 0) {
        local_20 = rnd(6);
      }
      else {
        local_20 = 1;
      }
      local_1c = local_20;
      iVar1 = local_1c;
    }
    else {
      iVar1 = local_1c;
      if (u.acurr.a[0] < 'g') {
        iVar1 = rnd(10);
      }
    }
  }
  local_1c = iVar1;
  if ((otmp == (obj *)0x0) || ((*(uint *)&otmp->field_0x4a & 1) == 0)) {
    local_24 = local_1c;
  }
  else {
    local_24 = -local_1c;
  }
  adjattrib(0,local_24,force,1);
  return;
}

Assistant:

void gainstr(struct obj *otmp, int incr, boolean force)
{
	int num = 1;

	if (incr) num = incr;
	else {
	    if (ABASE(A_STR) < 18) num = (rn2(4) ? 1 : rnd(6) );
	    else if (ABASE(A_STR) < STR18(85)) num = rnd(10);
	}
	adjattrib(A_STR, (otmp && otmp->cursed) ? -num : num, force, 1);
}